

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int compareFileMem(char *filename,char *mem,int size)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  char *__format;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  stat info;
  char bytes [4096];
  
  if (update_results == '\x01') {
    iVar1 = open64(filename,0x241,0x1a4);
    if (-1 < iVar1) {
      sVar3 = write(iVar1,mem,(long)size);
      close(iVar1);
      uVar6 = (uint)sVar3;
LAB_00108bf9:
      return (uint)(uVar6 != size);
    }
    __format = "failed to open %s for writing";
  }
  else {
    iVar1 = stat64(filename,(stat64 *)&info);
    if (iVar1 < 0) {
      __format = "failed to stat %s\n";
    }
    else {
      if (info.st_size != size) {
        fprintf(_stderr,"file %s is %ld bytes, result is %d bytes\n",filename,info.st_size,
                (ulong)(uint)size);
        return -1;
      }
      iVar1 = open64(filename,0);
      if (-1 < iVar1) {
        uVar6 = 0;
        do {
          if (size <= (int)uVar6) {
LAB_00108be2:
            close(iVar1);
            if (uVar6 != size) {
              fprintf(_stderr,"Compare error index %d, size %d\n",(ulong)uVar6,(ulong)(uint)size);
            }
            goto LAB_00108bf9;
          }
          sVar3 = read(iVar1,bytes,0x1000);
          uVar5 = (uint)sVar3;
          if (((int)uVar5 < 1) || (uVar8 = uVar6 + uVar5, size < (int)uVar8)) goto LAB_00108be2;
          uVar7 = (ulong)uVar6;
          iVar2 = bcmp(bytes,mem + uVar7,(ulong)(uVar5 & 0x7fffffff));
          uVar6 = uVar8;
        } while (iVar2 == 0);
        uVar4 = 0;
        do {
          if ((uVar5 & 0x7fffffff) == uVar4) {
LAB_00108c99:
            fprintf(_stderr,"Compare error at position %d\n",(ulong)uVar8);
            close(iVar1);
            return 1;
          }
          if (bytes[uVar4] != mem[uVar7]) {
            uVar8 = (uint)uVar7;
            goto LAB_00108c99;
          }
          uVar4 = uVar4 + 1;
          uVar7 = uVar7 + 1;
        } while( true );
      }
      __format = "failed to open %s for reading";
    }
  }
  fprintf(_stderr,__format,filename);
  return -1;
}

Assistant:

static int compareFileMem(const char *filename, const char *mem, int size) {
    int res;
    int fd;
    char bytes[4096];
    int idx = 0;
    struct stat info;

    if (update_results) {
        fd = open(filename, WR_FLAGS, 0644);
        if (fd < 0) {
	    fprintf(stderr, "failed to open %s for writing", filename);
            return(-1);
	}
        res = write(fd, mem, size);
        close(fd);
        return(res != size);
    }

    if (stat(filename, &info) < 0) {
        fprintf(stderr, "failed to stat %s\n", filename);
	return(-1);
    }
    if (info.st_size != size) {
        fprintf(stderr, "file %s is %ld bytes, result is %d bytes\n",
	        filename, (long) info.st_size, size);
        return(-1);
    }
    fd = open(filename, RD_FLAGS);
    if (fd < 0) {
	fprintf(stderr, "failed to open %s for reading", filename);
        return(-1);
    }
    while (idx < size) {
        res = read(fd, bytes, 4096);
	if (res <= 0)
	    break;
	if (res + idx > size)
	    break;
	if (memcmp(bytes, &mem[idx], res) != 0) {
	    int ix;
	    for (ix=0; ix<res; ix++)
		if (bytes[ix] != mem[idx+ix])
			break;
	    fprintf(stderr,"Compare error at position %d\n", idx+ix);
	    close(fd);
	    return(1);
	}
	idx += res;
    }
    close(fd);
    if (idx != size) {
	fprintf(stderr,"Compare error index %d, size %d\n", idx, size);
    }
    return(idx != size);
}